

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  float fVar1;
  complex<float> **ppcVar2;
  complex<float> *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  complex<float> *pcVar6;
  complex<float> *__y;
  long lVar7;
  long col;
  long lVar8;
  long row;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float local_68;
  float fStack_64;
  complex<float> local_38;
  int extraout_var_00;
  
  lVar7 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar7 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  col = 0;
  lVar7 = 0;
  if (lVar5 != 0 && -1 < extraout_var_00) {
    lVar7 = lVar5;
  }
  do {
    if ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= col) {
      return 1;
    }
    for (lVar8 = 0; row = lVar7, lVar7 != lVar8; lVar8 = lVar8 + 1) {
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(B,lVar8,col);
      row = lVar8;
      if ((((*(float *)&pcVar6->_M_value != 0.0) || (NAN(*(float *)&pcVar6->_M_value))) ||
          (fVar1 = *(float *)((long)&pcVar6->_M_value + 4), fVar1 != 0.0)) || (NAN(fVar1))) break;
    }
    lVar8 = row;
    if (row < lVar5) {
      lVar8 = lVar5;
    }
    while (row != lVar8) {
      ppcVar2 = (this->fElem).fStore;
      pcVar6 = ppcVar2[row];
      pcVar3 = ppcVar2[row + 1];
      __y = TPZFMatrix<std::complex<float>_>::operator()(B,row,col);
      local_68 = 0.0;
      fStack_64 = 0.0;
      while( true ) {
        __y = __y + -1;
        pcVar6 = pcVar6 + 1;
        if (pcVar3 <= pcVar6) break;
        local_38._M_value = pcVar6->_M_value ^ 0x8000000000000000;
        std::operator*(&local_38,__y);
        local_68 = local_68 + extraout_XMM0_Da;
        fStack_64 = fStack_64 + extraout_XMM0_Db;
      }
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(B,row,col);
      pcVar6->_M_value =
           CONCAT44((float)(pcVar6->_M_value >> 0x20) - fStack_64,(float)pcVar6->_M_value - local_68
                   );
      std::complex<float>::operator/=(pcVar6,(this->fElem).fStore[row]);
      row = row + 1;
    }
    col = col + 1;
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}